

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O2

int64_t summary_all_avx2(__m256i *sum_all)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  auVar4 = vpunpckldq_avx2((undefined1  [32])*sum_all,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  auVar3 = vpunpckhdq_avx2((undefined1  [32])*sum_all,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  auVar3 = vpaddq_avx2(auVar4,auVar3);
  auVar1 = vpaddq_avx(auVar3._0_16_,auVar3._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddq_avx(auVar1,auVar2);
  return auVar1._0_8_;
}

Assistant:

static inline int64_t summary_all_avx2(const __m256i *sum_all) {
  int64_t sum;
  __m256i zero = _mm256_setzero_si256();
  const __m256i sum0_4x64 = _mm256_unpacklo_epi32(*sum_all, zero);
  const __m256i sum1_4x64 = _mm256_unpackhi_epi32(*sum_all, zero);
  const __m256i sum_4x64 = _mm256_add_epi64(sum0_4x64, sum1_4x64);
  const __m128i sum_2x64 = _mm_add_epi64(_mm256_castsi256_si128(sum_4x64),
                                         _mm256_extracti128_si256(sum_4x64, 1));
  const __m128i sum_1x64 = _mm_add_epi64(sum_2x64, _mm_srli_si128(sum_2x64, 8));
  xx_storel_64(&sum, sum_1x64);
  return sum;
}